

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::SMDImporter(SMDImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008f40d8;
  this->configFrameID = 0;
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->pScene = (aiScene *)0x0;
  this->iFileSize = 0;
  (this->aszTextures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aszTextures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aszTextures).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->iSmallestFrame = 0x7fffffff;
  this->dLengthOfAnim = 0.0;
  this->bHasUVs = false;
  this->iLineNumber = 0xffffffff;
  this->bLoadAnimationList = true;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

SMDImporter::SMDImporter()
: configFrameID()
, mBuffer()
, pScene( nullptr )
, iFileSize( 0 )
, iSmallestFrame( INT_MAX )
, dLengthOfAnim( 0.0 )
, bHasUVs(false )
, iLineNumber(-1)  {
    // empty
}